

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
sf2cute::SoundFont::RemovePresetIf
          (SoundFont *this,function<bool_(const_std::shared_ptr<sf2cute::SFPreset>_&)> *predicate)

{
  __normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
  local_50;
  const_iterator local_48;
  function<bool_(const_std::shared_ptr<sf2cute::SFPreset>_&)> *local_40;
  shared_ptr<sf2cute::SFPreset> *local_38;
  __normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
  local_28;
  const_iterator local_20;
  function<bool_(const_std::shared_ptr<sf2cute::SFPreset>_&)> *local_18;
  function<bool_(const_std::shared_ptr<sf2cute::SFPreset>_&)> *predicate_local;
  SoundFont *this_local;
  
  local_18 = predicate;
  predicate_local = (function<bool_(const_std::shared_ptr<sf2cute::SFPreset>_&)> *)this;
  local_30._M_current =
       (shared_ptr<sf2cute::SFPreset> *)
       std::
       vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
       ::begin(&this->presets_);
  local_38 = (shared_ptr<sf2cute::SFPreset> *)
             std::
             vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
             ::end(&this->presets_);
  local_40 = predicate;
  local_28 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFPreset>*,std::vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>>,sf2cute::SoundFont::RemovePresetIf(std::function<bool(std::shared_ptr<sf2cute::SFPreset>const&)>)::__0>
                       (local_30,(__normal_iterator<std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
                                  )local_38,(anon_class_8_1_c53f3057_for__M_pred)predicate);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<sf2cute::SFPreset>const*,std::vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>>
  ::__normal_iterator<std::shared_ptr<sf2cute::SFPreset>*>
            ((__normal_iterator<std::shared_ptr<sf2cute::SFPreset>const*,std::vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>>
              *)&local_20,&local_28);
  local_50._M_current =
       (shared_ptr<sf2cute::SFPreset> *)
       std::
       vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
       ::end(&this->presets_);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<sf2cute::SFPreset>const*,std::vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>>
  ::__normal_iterator<std::shared_ptr<sf2cute::SFPreset>*>
            ((__normal_iterator<std::shared_ptr<sf2cute::SFPreset>const*,std::vector<std::shared_ptr<sf2cute::SFPreset>,std::allocator<std::shared_ptr<sf2cute::SFPreset>>>>
              *)&local_48,&local_50);
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  erase(&this->presets_,local_20,local_48);
  return;
}

Assistant:

void SoundFont::RemovePresetIf(
    std::function<bool(const std::shared_ptr<SFPreset> &)> predicate) {
  presets_.erase(std::remove_if(presets_.begin(), presets_.end(),
    [&predicate](const std::shared_ptr<SFPreset> & preset) -> bool {
      if (predicate(preset)) {
        preset->reset_parent_file();
        return true;
      }
      else {
        return false;
      }
    }), presets_.end());
}